

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O0

fsg_model_t * fsg_model_readfile(char *file,logmath_t *lmath,float32 lw)

{
  FILE *__stream;
  fsg_model_t *fsg;
  FILE *fp;
  float32 lw_local;
  logmath_t *lmath_local;
  char *file_local;
  
  __stream = fopen(file,"r");
  if (__stream == (FILE *)0x0) {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                   ,0x2db,"Failed to open FSG file \'%s\' for reading",file);
    file_local = (char *)0x0;
  }
  else {
    file_local = (char *)fsg_model_read((FILE *)__stream,lmath,lw);
    fclose(__stream);
  }
  return (fsg_model_t *)file_local;
}

Assistant:

fsg_model_t *
fsg_model_readfile(const char *file, logmath_t * lmath, float32 lw)
{
    FILE *fp;
    fsg_model_t *fsg;

    if ((fp = fopen(file, "r")) == NULL) {
        E_ERROR_SYSTEM("Failed to open FSG file '%s' for reading", file);
        return NULL;
    }
    fsg = fsg_model_read(fp, lmath, lw);
    fclose(fp);
    return fsg;
}